

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

CoverageBinsSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CoverageBinsSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::CoverageBinsArraySizeSyntax*,slang::parsing::Token,slang::syntax::CoverageBinInitializerSyntax&,slang::syntax::CoverageIffClauseSyntax*,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,CoverageBinsArraySizeSyntax **args_4,
          Token *args_5,CoverageBinInitializerSyntax *args_6,CoverageIffClauseSyntax **args_7,
          Token *args_8)

{
  Token keyword;
  Token wildcard;
  Token equals;
  Token semi;
  CoverageBinsSyntax *pCVar1;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_R8;
  undefined8 *in_stack_00000008;
  CoverageBinsSyntax *in_stack_00000010;
  undefined8 *in_stack_00000018;
  Token *in_stack_00000020;
  size_t in_stack_ffffffffffffff18;
  size_t in_stack_ffffffffffffff20;
  BumpAllocator *in_stack_ffffffffffffff28;
  Info *in_stack_ffffffffffffff50;
  
  pCVar1 = (CoverageBinsSyntax *)
           allocate(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  wildcard.info = in_stack_ffffffffffffff50;
  wildcard._0_8_ = in_stack_00000020->info;
  keyword.info = *(Info **)in_stack_00000020;
  keyword._0_8_ = *in_stack_00000018;
  equals.info = (Info *)*in_R8;
  equals._0_8_ = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_00000008[1];
  semi.info = (Info *)*in_RDX;
  semi._0_8_ = in_RCX[1];
  slang::syntax::CoverageBinsSyntax::CoverageBinsSyntax
            (in_stack_00000010,
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_00000008[1],wildcard,
             keyword,*in_stack_00000020,(CoverageBinsArraySizeSyntax *)*in_stack_00000008,equals,
             (CoverageBinInitializerSyntax *)in_R8[1],(CoverageIffClauseSyntax *)*in_RCX,semi);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }